

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *field)

{
  size_t *psVar1;
  pointer *pppTVar2;
  TypeModuleField *pTVar3;
  tuple<wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_> tVar4;
  iterator __position;
  ModuleField *pMVar5;
  ModuleFieldList *pMVar6;
  _Head_base<0UL,_wabt::TypeEntry_*,_false> local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pTVar3 = (field->_M_t).
           super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
           .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
  tVar4.super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
  super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_> *)
        &(pTVar3->type)._M_t.
         super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>;
  if (*(size_type *)
       ((long)tVar4.super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>
              .super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl + 0x30) != 0) {
    local_48._M_head_impl =
         (TypeEntry *)
         (((Location *)
          ((long)&(pTVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField +
          0x18))->filename).data_;
    uStack_40 = *(undefined4 *)
                 ((long)&(pTVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField + 0x20);
    uStack_3c = *(undefined4 *)
                 ((long)&(pTVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField + 0x24);
    local_38 = (((anon_union_16_2_ecfd7102_for_Location_1 *)
                ((long)&(pTVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField
                + 0x28))->field_0).line;
    uStack_34 = *(undefined4 *)
                 ((long)&(pTVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField + 0x2c);
    uStack_30 = *(undefined4 *)
                 ((long)&(pTVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField + 0x30);
    uStack_2c = *(undefined4 *)
                 ((long)&(pTVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).
                         super_ModuleField + 0x34);
    local_28 = (undefined4)
               ((ulong)((long)(this->types).
                              super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->types).
                             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->type_bindings,0,
               (string *)
               ((long)tVar4.
                      super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>
                      .super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl + 0x28));
  }
  __position._M_current =
       (this->types).super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48._M_head_impl =
       (TypeEntry *)
       tVar4.super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
       super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
  if (__position._M_current ==
      (this->types).super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::TypeEntry*,std::allocator<wabt::TypeEntry*>>::
    _M_realloc_insert<wabt::TypeEntry*>
              ((vector<wabt::TypeEntry*,std::allocator<wabt::TypeEntry*>> *)&this->types,__position,
               (TypeEntry **)&local_48);
  }
  else {
    *__position._M_current =
         (TypeEntry *)
         tVar4.super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
         super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
    pppTVar2 = &(this->types).
                super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar2 = *pppTVar2 + 1;
  }
  pTVar3 = (field->_M_t).
           super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
           .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl = (TypeModuleField *)0x0;
  if ((*(ModuleField **)
        ((long)&(pTVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField + 0x10)
       == (ModuleField *)0x0) &&
     (((intrusive_list_base<wabt::ModuleField> *)
      ((long)&(pTVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField + 8))->
      next_ == (ModuleField *)0x0)) {
    pMVar5 = (this->fields).last_;
    if (pMVar5 == (ModuleField *)0x0) {
      pMVar6 = &this->fields;
    }
    else {
      *(ModuleField **)
       ((long)&(pTVar3->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField + 0x10)
           = pMVar5;
      pMVar6 = (ModuleFieldList *)&pMVar5->super_intrusive_list_base<wabt::ModuleField>;
    }
    pMVar6->first_ = (ModuleField *)pTVar3;
    (this->fields).last_ = (ModuleField *)pTVar3;
    psVar1 = &(this->fields).size_;
    *psVar1 = *psVar1 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<TypeModuleField> field) {
  TypeEntry& type = *field->type;
  if (!type.name.empty()) {
    type_bindings.emplace(type.name, Binding(field->loc, types.size()));
  }
  types.push_back(&type);
  fields.push_back(std::move(field));
}